

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

int loader_metadata_cb_iterate(plugin_manager manager,plugin p,void *data)

{
  long lVar1;
  loader_impl impl;
  value pvVar2;
  
  impl = (loader_impl)plugin_impl(p);
  pvVar2 = loader_metadata_impl(p,impl);
  lVar1 = *data;
  *(value *)(*(long *)((long)data + 8) + lVar1 * 8) = pvVar2;
  if (*(long *)(*(long *)((long)data + 8) + lVar1 * 8) != 0) {
    *(long *)data = lVar1 + 1;
  }
  return 0;
}

Assistant:

int loader_metadata_cb_iterate(plugin_manager manager, plugin p, void *data)
{
	loader_impl impl = plugin_impl_type(p, loader_impl);
	loader_metadata_cb_iterator metadata_iterator = data;

	(void)manager;

	metadata_iterator->values[metadata_iterator->iterator] = loader_metadata_impl(p, impl);

	if (metadata_iterator->values[metadata_iterator->iterator] != NULL)
	{
		++metadata_iterator->iterator;
	}

	return 0;
}